

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE.c
# Opt level: O2

asn_dec_rval_t
SEQUENCE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                   char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  asn_TYPE_member_s *paVar2;
  int *piVar3;
  asn_TYPE_member_s *paVar4;
  short sVar5;
  uint uVar6;
  xer_check_tag_e tcv;
  int iVar7;
  long lVar8;
  ssize_t sVar9;
  void **ppvVar10;
  void **ppvVar11;
  size_t sVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  asn_dec_rval_t aVar17;
  undefined8 uStack_b0;
  ulong local_98;
  pxer_chunk_type_e ch_type;
  char *local_60;
  ber_tlv_len_t *local_58;
  void *local_50;
  asn_codec_ctx_t *local_48;
  int *local_40;
  void *memb_ptr;
  size_t sVar12;
  
  local_60 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_60 = td->xml_tag;
  }
  paVar2 = td->elements;
  piVar3 = (int *)td->specifics;
  local_50 = *struct_ptr;
  local_48 = opt_codec_ctx;
  if (local_50 == (void *)0x0) {
    local_50 = calloc(1,(long)*piVar3);
    *struct_ptr = local_50;
    if (local_50 == (void *)0x0) {
      uStack_b0 = 2;
      sVar13 = 0;
      goto LAB_001437da;
    }
  }
  lVar8 = (long)piVar3[1];
  psVar1 = (short *)((long)local_50 + lVar8);
  local_40 = (int *)((long)local_50 + lVar8 + 4);
  local_98 = (ulong)(uint)(int)*(short *)((long)local_50 + lVar8 + 2);
  local_58 = (ber_tlv_len_t *)((long)local_50 + lVar8 + 0x10);
  sVar13 = 0;
LAB_0014346b:
  if (*psVar1 < 4) {
    if (*psVar1 == 2) {
      paVar4 = td->elements;
      lVar8 = (long)(int)local_98;
      ppvVar10 = (void **)((long)paVar4[lVar8].memb_offset + (long)local_50);
      ppvVar11 = ppvVar10;
      if ((paVar4[lVar8].flags & ATF_POINTER) == ATF_NOFLAGS) {
        ppvVar11 = &memb_ptr;
        memb_ptr = ppvVar10;
      }
      aVar17 = (*(paVar4[lVar8].type)->xer_decoder)
                         (local_48,paVar4[lVar8].type,ppvVar11,paVar4[lVar8].name,buf_ptr,size);
      sVar12 = aVar17.consumed;
      uStack_b0 = aVar17._0_8_;
      sVar13 = sVar13 + sVar12;
      if (aVar17.code != RC_OK) goto LAB_001437da;
      size = size - sVar12;
      buf_ptr = (void *)((long)buf_ptr + sVar12);
      *psVar1 = 1;
      uVar6 = (int)local_98 + 1;
      local_98 = (ulong)uVar6;
      psVar1[1] = (short)uVar6;
    }
    sVar9 = xer_next_token(local_40,buf_ptr,size,&ch_type);
    if (sVar9 == -1) goto LAB_001437d7;
    if (ch_type - PXER_TEXT < 2) goto code_r0x00143518;
    if (ch_type == PXER_WMORE) {
      uStack_b0 = 1;
      goto LAB_001437da;
    }
    tcv = xer_check_tag(buf_ptr,(int)sVar9,local_60);
    if (*psVar1 == 3) {
      iVar7 = xer_skip_unknown(tcv,local_58);
      switch(iVar7) {
      case 0:
        buf_ptr = (void *)((long)buf_ptr + sVar9);
        size = size - sVar9;
        sVar13 = sVar13 + sVar9;
        goto LAB_0014346b;
      case 1:
        buf_ptr = (void *)((long)buf_ptr + sVar9);
        size = size - sVar9;
        sVar13 = sVar13 + sVar9;
        *psVar1 = 1;
        goto LAB_0014346b;
      case 2:
        *psVar1 = 1;
        break;
      case -1:
        *psVar1 = 4;
        goto LAB_001437d7;
      }
    }
    if (6 < tcv - XCT_OPENING) goto switchD_001435b6_caseD_4;
    uVar16 = (ulong)(int)local_98;
    switch(tcv) {
    case XCT_OPENING:
      sVar5 = *psVar1;
      if (sVar5 == 0) {
        buf_ptr = (void *)((long)buf_ptr + sVar9);
        size = size - sVar9;
        sVar13 = sVar13 + sVar9;
        *psVar1 = 1;
        goto LAB_0014346b;
      }
      break;
    case XCT_CLOSING:
      if (*psVar1 == 0) goto switchD_001435b6_caseD_4;
      *psVar1 = 0;
LAB_00143798:
      iVar7 = td->elements_count;
      if ((((int)local_98 < iVar7) && (paVar2[uVar16].optional + (int)local_98 != iVar7)) &&
         (((int)local_98 <= piVar3[10] || (piVar3[0xb] <= iVar7)))) goto LAB_001437d7;
      sVar13 = sVar13 + sVar9;
      *psVar1 = 4;
      uStack_b0 = 0;
      goto LAB_001437da;
    case XCT_BOTH:
      sVar5 = *psVar1;
      if (sVar5 == 0) goto LAB_00143798;
      break;
    default:
      goto switchD_001435b6_caseD_4;
    case XCT_UNKNOWN_OP:
    case XCT_UNKNOWN_BO:
      sVar5 = *psVar1;
    }
    if (sVar5 == 1) {
      iVar7 = td->elements_count;
      if ((int)local_98 < iVar7) {
        iVar14 = paVar2[uVar16].optional + (int)local_98 + 1;
        if (iVar7 <= paVar2[uVar16].optional + (int)local_98) {
          iVar14 = iVar7;
        }
        uVar15 = uVar16 * 0x40 | 0x38;
        while ((long)uVar16 < (long)iVar14) {
          tcv = xer_check_tag(buf_ptr,(int)sVar9,*(char **)((long)&td->elements->flags + uVar15));
          switch(tcv) {
          case XCT_OPENING:
          case XCT_BOTH:
            psVar1[1] = (short)uVar16;
            *psVar1 = 2;
            local_98 = uVar16 & 0xffffffff;
            goto LAB_001436b9;
          default:
            goto LAB_001436f2;
          case XCT_UNKNOWN_OP:
          case XCT_UNKNOWN_BO:
            uVar16 = uVar16 + 1;
            uVar15 = uVar15 + 0x40;
          }
        }
LAB_001436b9:
        if ((int)uVar16 != iVar14) goto LAB_0014346b;
      }
LAB_001436f2:
      iVar7 = (int)local_98;
      if (iVar7 < td->elements_count) {
        iVar14 = paVar2[iVar7].optional;
        if (piVar3[10] < iVar14 + iVar7) {
LAB_00143736:
          if (iVar14 + iVar7 < piVar3[0xb]) {
            if ((tcv & XCT_CLOSING) == XCT_BROKEN) {
              psVar1[8] = 1;
              psVar1[9] = 0;
              psVar1[10] = 0;
              psVar1[0xb] = 0;
              *psVar1 = 3;
            }
            buf_ptr = (void *)((long)buf_ptr + sVar9);
            size = size - sVar9;
            sVar13 = sVar13 + sVar9;
            goto LAB_0014346b;
          }
        }
      }
      else {
        iVar14 = 0;
        if (piVar3[10] < iVar7) goto LAB_00143736;
      }
    }
switchD_001435b6_caseD_4:
  }
  *psVar1 = 4;
LAB_001437d7:
  uStack_b0 = 2;
LAB_001437da:
  aVar17.consumed = sVar13;
  aVar17._0_8_ = uStack_b0;
  return aVar17;
code_r0x00143518:
  buf_ptr = (void *)((long)buf_ptr + sVar9);
  size = size - sVar9;
  sVar13 = sVar13 + sVar9;
  goto LAB_0014346b;
}

Assistant:

asn_dec_rval_t
SEQUENCE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SEQUENCE_specifics_t *specs
		= (asn_SEQUENCE_specifics_t *)td->specifics;
	asn_TYPE_member_t *elements = td->elements;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */
	int edx_end;

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);


	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Skipping unknown extensions.
	 * Phase 4: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 3;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;
		int n;

		/*
		 * Go inside the inner member of a sequence.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st + elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Invoke the inner type decoder, m.b. multiple times */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			ctx->phase = 1;	/* Back to body processing */
			ctx->step = ++edx;
			ASN_DEBUG("XER/SEQUENCE phase => %d, step => %d",
				ctx->phase, ctx->step);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size,
			&ch_type);
		if(ch_size == -1) {
		    RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SEQUENCE: tcv = %d, ph=%d [%s]",
			tcv, ctx->phase, xml_tag);

		/* Skip the extensions section */
		if(ctx->phase == 3) {
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 4;
				RETURN(RC_FAIL);
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 1:
				XER_ADVANCE(ch_size);
				ctx->phase = 1;
				continue;
			case 2:
				ctx->phase = 1;
				break;
			}
		}

		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				if(edx >= td->elements_count
				   ||
				   /* Explicit OPTIONAL specs reaches the end */
				    (edx + elements[edx].optional
					== td->elements_count)
				   ||
				   /* All extensions are optional */
				   (IN_EXTENSION_GROUP(specs, edx)
					&& specs->ext_before
						> td->elements_count)
				) {
					XER_ADVANCE(ch_size);
					ctx->phase = 4;	/* Phase out */
					RETURN(RC_OK);
				} else {
					ASN_DEBUG("Premature end of XER SEQUENCE");
					RETURN(RC_FAIL);
				}
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SEQUENCE: tcv=%d, ph=%d, edx=%d",
				tcv, ctx->phase, edx);
			if(ctx->phase != 1) {
				break;	/* Really unexpected */
			}

			if(edx < td->elements_count) {
				/*
				 * Search which member corresponds to this tag.
				 */
				edx_end = edx + elements[edx].optional + 1;
				if(edx_end > td->elements_count)
					edx_end = td->elements_count;
				for(n = edx; n < edx_end; n++) {
					elm = &td->elements[n];
					tcv = xer_check_tag(buf_ptr,
						ch_size, elm->name);
					switch(tcv) {
					case XCT_BOTH:
					case XCT_OPENING:
						/*
						 * Process this member.
						 */
						ctx->step = edx = n;
						ctx->phase = 2;
						break;
					case XCT_UNKNOWN_OP:
					case XCT_UNKNOWN_BO:
						continue;
					default:
						n = edx_end;
						break;	/* Phase out */
					}
					break;
				}
				if(n != edx_end)
					continue;
			} else {
				ASN_DEBUG("Out of defined members: %d/%d",
					edx, td->elements_count);
			}

			/* It is expected extension */
			if(IN_EXTENSION_GROUP(specs,
				edx + (edx < td->elements_count
					? elements[edx].optional : 0))) {
				ASN_DEBUG("Got anticipated extension at %d",
					edx);
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
				} else {
					ctx->left = 1;
					ctx->phase = 3;	/* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SEQUENCE [%c%c%c%c%c%c]",
			size>0?((const char *)buf_ptr)[0]:'.',
			size>1?((const char *)buf_ptr)[1]:'.',
			size>2?((const char *)buf_ptr)[2]:'.',
			size>3?((const char *)buf_ptr)[3]:'.',
			size>4?((const char *)buf_ptr)[4]:'.',
			size>5?((const char *)buf_ptr)[5]:'.');
		break;
	}

	ctx->phase = 4;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}